

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xpath_ast_node * __thiscall
pugi::impl::anon_unknown_0::xpath_parser::parse_function
          (xpath_parser *this,xpath_lexer_string *name,size_t argc,xpath_ast_node **args)

{
  bool bVar1;
  xpath_value_type xVar2;
  xpath_ast_node *pxVar3;
  xpath_ast_node *in_RCX;
  xpath_parser *this_00;
  xpath_ast_node *in_RDX;
  undefined8 *in_RSI;
  xpath_parser *in_RDI;
  xpath_parser *pxVar4;
  
  this_00 = (xpath_parser *)(ulong)((int)*(char *)*in_RSI - 0x62);
  switch(this_00) {
  case (xpath_parser *)0x0:
    pxVar4 = in_RDI;
    bVar1 = xpath_lexer_string::operator==((xpath_lexer_string *)this_00,(char_t *)in_RDI);
    if ((bVar1) && (in_RDX == (xpath_ast_node *)0x1)) {
      pxVar3 = alloc_node(pxVar4,(ast_type_t)((ulong)in_RSI >> 0x20),(xpath_value_type)in_RSI,
                          (xpath_ast_node *)0x1,in_RCX);
      return pxVar3;
    }
    break;
  case (xpath_parser *)0x1:
    pxVar4 = in_RDI;
    bVar1 = xpath_lexer_string::operator==((xpath_lexer_string *)this_00,(char_t *)in_RDI);
    if ((bVar1) && (in_RDX == (xpath_ast_node *)0x1)) {
      xVar2 = xpath_ast_node::rettype(*(xpath_ast_node **)in_RCX);
      if (xVar2 != xpath_type_node_set) {
        pxVar3 = error(this_00,(char *)in_RDI);
        return pxVar3;
      }
      pxVar3 = alloc_node(pxVar4,(ast_type_t)((ulong)in_RSI >> 0x20),(xpath_value_type)in_RSI,in_RDX
                          ,in_RCX);
      return pxVar3;
    }
    bVar1 = xpath_lexer_string::operator==((xpath_lexer_string *)this_00,(char_t *)in_RDI);
    if ((bVar1) && (in_RDX == (xpath_ast_node *)0x2)) {
      pxVar3 = alloc_node(pxVar4,(ast_type_t)((ulong)in_RSI >> 0x20),(xpath_value_type)in_RSI,
                          (xpath_ast_node *)0x2,in_RCX);
      return pxVar3;
    }
    bVar1 = xpath_lexer_string::operator==((xpath_lexer_string *)this_00,(char_t *)in_RDI);
    if ((bVar1) && ((xpath_ast_node *)0x1 < in_RDX)) {
      pxVar3 = alloc_node(pxVar4,(ast_type_t)((ulong)in_RSI >> 0x20),(xpath_value_type)in_RSI,in_RDX
                          ,in_RCX);
      return pxVar3;
    }
    bVar1 = xpath_lexer_string::operator==((xpath_lexer_string *)this_00,(char_t *)in_RDI);
    if ((bVar1) && (in_RDX == (xpath_ast_node *)0x1)) {
      pxVar3 = alloc_node(pxVar4,(ast_type_t)((ulong)in_RSI >> 0x20),(xpath_value_type)in_RSI,
                          (xpath_ast_node *)0x1,in_RCX);
      return pxVar3;
    }
    break;
  default:
    break;
  case (xpath_parser *)0x4:
    pxVar4 = in_RDI;
    bVar1 = xpath_lexer_string::operator==((xpath_lexer_string *)this_00,(char_t *)in_RDI);
    if ((bVar1) && (in_RDX == (xpath_ast_node *)0x0)) {
      pxVar3 = alloc_node(pxVar4,(ast_type_t)((ulong)in_RSI >> 0x20),(xpath_value_type)in_RSI,
                          (xpath_ast_node *)0x0,in_RCX);
      return pxVar3;
    }
    bVar1 = xpath_lexer_string::operator==((xpath_lexer_string *)this_00,(char_t *)in_RDI);
    if ((bVar1) && (in_RDX == (xpath_ast_node *)0x1)) {
      pxVar3 = alloc_node(pxVar4,(ast_type_t)((ulong)in_RSI >> 0x20),(xpath_value_type)in_RSI,
                          (xpath_ast_node *)0x1,in_RCX);
      return pxVar3;
    }
    break;
  case (xpath_parser *)0x7:
    pxVar4 = in_RDI;
    bVar1 = xpath_lexer_string::operator==((xpath_lexer_string *)this_00,(char_t *)in_RDI);
    if ((bVar1) && (in_RDX == (xpath_ast_node *)0x1)) {
      pxVar3 = alloc_node(pxVar4,(ast_type_t)((ulong)in_RSI >> 0x20),(xpath_value_type)in_RSI,
                          (xpath_ast_node *)0x1,in_RCX);
      return pxVar3;
    }
    break;
  case (xpath_parser *)0xa:
    pxVar4 = in_RDI;
    bVar1 = xpath_lexer_string::operator==((xpath_lexer_string *)this_00,(char_t *)in_RDI);
    if ((bVar1) && (in_RDX == (xpath_ast_node *)0x0)) {
      pxVar3 = alloc_node(pxVar4,(ast_type_t)((ulong)in_RSI >> 0x20),(xpath_value_type)in_RSI,
                          (xpath_ast_node *)0x0,in_RCX);
      return pxVar3;
    }
    bVar1 = xpath_lexer_string::operator==((xpath_lexer_string *)this_00,(char_t *)in_RDI);
    if ((bVar1) && (in_RDX == (xpath_ast_node *)0x1)) {
      pxVar3 = alloc_node(pxVar4,(ast_type_t)((ulong)in_RSI >> 0x20),(xpath_value_type)in_RSI,
                          (xpath_ast_node *)0x1,in_RCX);
      return pxVar3;
    }
    bVar1 = xpath_lexer_string::operator==((xpath_lexer_string *)this_00,(char_t *)in_RDI);
    if ((bVar1) && (in_RDX < (xpath_ast_node *)0x2)) {
      if ((in_RDX == (xpath_ast_node *)0x1) &&
         (xVar2 = xpath_ast_node::rettype(*(xpath_ast_node **)in_RCX), xVar2 != xpath_type_node_set)
         ) {
        pxVar3 = error(this_00,(char *)in_RDI);
        return pxVar3;
      }
      pxVar3 = alloc_node(pxVar4,(ast_type_t)((ulong)in_RSI >> 0x20),(xpath_value_type)in_RSI,in_RDX
                          ,in_RCX);
      return pxVar3;
    }
    break;
  case (xpath_parser *)0xc:
    pxVar4 = in_RDI;
    bVar1 = xpath_lexer_string::operator==((xpath_lexer_string *)this_00,(char_t *)in_RDI);
    if ((bVar1) && (in_RDX < (xpath_ast_node *)0x2)) {
      if ((in_RDX == (xpath_ast_node *)0x1) &&
         (xVar2 = xpath_ast_node::rettype(*(xpath_ast_node **)in_RCX), xVar2 != xpath_type_node_set)
         ) {
        pxVar3 = error(this_00,(char *)in_RDI);
        return pxVar3;
      }
      pxVar3 = alloc_node(pxVar4,(ast_type_t)((ulong)in_RSI >> 0x20),(xpath_value_type)in_RSI,in_RDX
                          ,in_RCX);
      return pxVar3;
    }
    bVar1 = xpath_lexer_string::operator==((xpath_lexer_string *)this_00,(char_t *)in_RDI);
    if ((bVar1) && (in_RDX < (xpath_ast_node *)0x2)) {
      if ((in_RDX == (xpath_ast_node *)0x1) &&
         (xVar2 = xpath_ast_node::rettype(*(xpath_ast_node **)in_RCX), xVar2 != xpath_type_node_set)
         ) {
        pxVar3 = error(this_00,(char *)in_RDI);
        return pxVar3;
      }
      pxVar3 = alloc_node(pxVar4,(ast_type_t)((ulong)in_RSI >> 0x20),(xpath_value_type)in_RSI,in_RDX
                          ,in_RCX);
      return pxVar3;
    }
    bVar1 = xpath_lexer_string::operator==((xpath_lexer_string *)this_00,(char_t *)in_RDI);
    if ((bVar1) && (in_RDX < (xpath_ast_node *)0x2)) {
      pxVar3 = alloc_node(pxVar4,(ast_type_t)((ulong)in_RSI >> 0x20),(xpath_value_type)in_RSI,in_RDX
                          ,in_RCX);
      return pxVar3;
    }
    bVar1 = xpath_lexer_string::operator==((xpath_lexer_string *)this_00,(char_t *)in_RDI);
    if ((bVar1) && (in_RDX == (xpath_ast_node *)0x1)) {
      pxVar3 = alloc_node(pxVar4,(ast_type_t)((ulong)in_RSI >> 0x20),(xpath_value_type)in_RSI,
                          (xpath_ast_node *)0x1,in_RCX);
      return pxVar3;
    }
    bVar1 = xpath_lexer_string::operator==((xpath_lexer_string *)this_00,(char_t *)in_RDI);
    if ((bVar1) && (in_RDX < (xpath_ast_node *)0x2)) {
      pxVar3 = alloc_node(pxVar4,(ast_type_t)((ulong)in_RSI >> 0x20),(xpath_value_type)in_RSI,in_RDX
                          ,in_RCX);
      return pxVar3;
    }
    break;
  case (xpath_parser *)0xe:
    pxVar4 = in_RDI;
    bVar1 = xpath_lexer_string::operator==((xpath_lexer_string *)this_00,(char_t *)in_RDI);
    if ((bVar1) && (in_RDX == (xpath_ast_node *)0x0)) {
      pxVar3 = alloc_node(pxVar4,(ast_type_t)((ulong)in_RSI >> 0x20),(xpath_value_type)in_RSI,
                          (xpath_ast_node *)0x0,in_RCX);
      return pxVar3;
    }
    break;
  case (xpath_parser *)0x10:
    pxVar4 = in_RDI;
    bVar1 = xpath_lexer_string::operator==((xpath_lexer_string *)this_00,(char_t *)in_RDI);
    if ((bVar1) && (in_RDX == (xpath_ast_node *)0x1)) {
      pxVar3 = alloc_node(pxVar4,(ast_type_t)((ulong)in_RSI >> 0x20),(xpath_value_type)in_RSI,
                          (xpath_ast_node *)0x1,in_RCX);
      return pxVar3;
    }
    break;
  case (xpath_parser *)0x11:
    pxVar4 = in_RDI;
    bVar1 = xpath_lexer_string::operator==((xpath_lexer_string *)this_00,(char_t *)in_RDI);
    if ((bVar1) && (in_RDX < (xpath_ast_node *)0x2)) {
      pxVar3 = alloc_node(pxVar4,(ast_type_t)((ulong)in_RSI >> 0x20),(xpath_value_type)in_RSI,in_RDX
                          ,in_RCX);
      return pxVar3;
    }
    bVar1 = xpath_lexer_string::operator==((xpath_lexer_string *)this_00,(char_t *)in_RDI);
    if ((bVar1) && (in_RDX < (xpath_ast_node *)0x2)) {
      pxVar3 = alloc_node(pxVar4,(ast_type_t)((ulong)in_RSI >> 0x20),(xpath_value_type)in_RSI,in_RDX
                          ,in_RCX);
      return pxVar3;
    }
    bVar1 = xpath_lexer_string::operator==((xpath_lexer_string *)this_00,(char_t *)in_RDI);
    if ((bVar1) && (in_RDX == (xpath_ast_node *)0x2)) {
      pxVar3 = alloc_node(pxVar4,(ast_type_t)((ulong)in_RSI >> 0x20),(xpath_value_type)in_RSI,
                          (xpath_ast_node *)0x2,in_RCX);
      return pxVar3;
    }
    bVar1 = xpath_lexer_string::operator==((xpath_lexer_string *)this_00,(char_t *)in_RDI);
    if ((bVar1) && (in_RDX == (xpath_ast_node *)0x2)) {
      pxVar3 = alloc_node(pxVar4,(ast_type_t)((ulong)in_RSI >> 0x20),(xpath_value_type)in_RSI,
                          (xpath_ast_node *)0x2,in_RCX);
      return pxVar3;
    }
    bVar1 = xpath_lexer_string::operator==((xpath_lexer_string *)this_00,(char_t *)in_RDI);
    if ((bVar1) && (in_RDX == (xpath_ast_node *)0x2)) {
      pxVar3 = alloc_node(pxVar4,(ast_type_t)((ulong)in_RSI >> 0x20),(xpath_value_type)in_RSI,
                          (xpath_ast_node *)0x2,in_RCX);
      return pxVar3;
    }
    bVar1 = xpath_lexer_string::operator==((xpath_lexer_string *)this_00,(char_t *)in_RDI);
    if ((bVar1) && ((in_RDX == (xpath_ast_node *)0x2 || (in_RDX == (xpath_ast_node *)0x3)))) {
      pxVar3 = alloc_node(pxVar4,(ast_type_t)((ulong)in_RSI >> 0x20),(xpath_value_type)in_RSI,in_RDX
                          ,in_RCX);
      return pxVar3;
    }
    bVar1 = xpath_lexer_string::operator==((xpath_lexer_string *)this_00,(char_t *)in_RDI);
    if ((bVar1) && (in_RDX == (xpath_ast_node *)0x1)) {
      xVar2 = xpath_ast_node::rettype(*(xpath_ast_node **)in_RCX);
      if (xVar2 != xpath_type_node_set) {
        pxVar3 = error(this_00,(char *)in_RDI);
        return pxVar3;
      }
      pxVar3 = alloc_node(pxVar4,(ast_type_t)((ulong)in_RSI >> 0x20),(xpath_value_type)in_RSI,in_RDX
                          ,in_RCX);
      return pxVar3;
    }
    break;
  case (xpath_parser *)0x12:
    pxVar4 = in_RDI;
    bVar1 = xpath_lexer_string::operator==((xpath_lexer_string *)this_00,(char_t *)in_RDI);
    if ((bVar1) && (in_RDX == (xpath_ast_node *)0x3)) {
      pxVar3 = alloc_node(pxVar4,(ast_type_t)((ulong)in_RSI >> 0x20),(xpath_value_type)in_RSI,
                          (xpath_ast_node *)0x3,in_RCX);
      return pxVar3;
    }
    bVar1 = xpath_lexer_string::operator==((xpath_lexer_string *)this_00,(char_t *)in_RDI);
    if ((bVar1) && (in_RDX == (xpath_ast_node *)0x0)) {
      pxVar3 = alloc_node(pxVar4,(ast_type_t)((ulong)in_RSI >> 0x20),(xpath_value_type)in_RSI,
                          (xpath_ast_node *)0x0,in_RCX);
      return pxVar3;
    }
  }
  pxVar3 = error(this_00,(char *)in_RDI);
  return pxVar3;
}

Assistant:

xpath_ast_node* parse_function(const xpath_lexer_string& name, size_t argc, xpath_ast_node* args[2])
		{
			switch (name.begin[0])
			{
			case 'b':
				if (name == PUGIXML_TEXT("boolean") && argc == 1)
					return alloc_node(ast_func_boolean, xpath_type_boolean, args[0]);

				break;

			case 'c':
				if (name == PUGIXML_TEXT("count") && argc == 1)
				{
					if (args[0]->rettype() != xpath_type_node_set) return error("Function has to be applied to node set");
					return alloc_node(ast_func_count, xpath_type_number, args[0]);
				}
				else if (name == PUGIXML_TEXT("contains") && argc == 2)
					return alloc_node(ast_func_contains, xpath_type_boolean, args[0], args[1]);
				else if (name == PUGIXML_TEXT("concat") && argc >= 2)
					return alloc_node(ast_func_concat, xpath_type_string, args[0], args[1]);
				else if (name == PUGIXML_TEXT("ceiling") && argc == 1)
					return alloc_node(ast_func_ceiling, xpath_type_number, args[0]);

				break;

			case 'f':
				if (name == PUGIXML_TEXT("false") && argc == 0)
					return alloc_node(ast_func_false, xpath_type_boolean);
				else if (name == PUGIXML_TEXT("floor") && argc == 1)
					return alloc_node(ast_func_floor, xpath_type_number, args[0]);

				break;

			case 'i':
				if (name == PUGIXML_TEXT("id") && argc == 1)
					return alloc_node(ast_func_id, xpath_type_node_set, args[0]);

				break;

			case 'l':
				if (name == PUGIXML_TEXT("last") && argc == 0)
					return alloc_node(ast_func_last, xpath_type_number);
				else if (name == PUGIXML_TEXT("lang") && argc == 1)
					return alloc_node(ast_func_lang, xpath_type_boolean, args[0]);
				else if (name == PUGIXML_TEXT("local-name") && argc <= 1)
				{
					if (argc == 1 && args[0]->rettype() != xpath_type_node_set) return error("Function has to be applied to node set");
					return alloc_node(argc == 0 ? ast_func_local_name_0 : ast_func_local_name_1, xpath_type_string, args[0]);
				}

				break;

			case 'n':
				if (name == PUGIXML_TEXT("name") && argc <= 1)
				{
					if (argc == 1 && args[0]->rettype() != xpath_type_node_set) return error("Function has to be applied to node set");
					return alloc_node(argc == 0 ? ast_func_name_0 : ast_func_name_1, xpath_type_string, args[0]);
				}
				else if (name == PUGIXML_TEXT("namespace-uri") && argc <= 1)
				{
					if (argc == 1 && args[0]->rettype() != xpath_type_node_set) return error("Function has to be applied to node set");
					return alloc_node(argc == 0 ? ast_func_namespace_uri_0 : ast_func_namespace_uri_1, xpath_type_string, args[0]);
				}
				else if (name == PUGIXML_TEXT("normalize-space") && argc <= 1)
					return alloc_node(argc == 0 ? ast_func_normalize_space_0 : ast_func_normalize_space_1, xpath_type_string, args[0], args[1]);
				else if (name == PUGIXML_TEXT("not") && argc == 1)
					return alloc_node(ast_func_not, xpath_type_boolean, args[0]);
				else if (name == PUGIXML_TEXT("number") && argc <= 1)
					return alloc_node(argc == 0 ? ast_func_number_0 : ast_func_number_1, xpath_type_number, args[0]);

				break;

			case 'p':
				if (name == PUGIXML_TEXT("position") && argc == 0)
					return alloc_node(ast_func_position, xpath_type_number);

				break;

			case 'r':
				if (name == PUGIXML_TEXT("round") && argc == 1)
					return alloc_node(ast_func_round, xpath_type_number, args[0]);

				break;

			case 's':
				if (name == PUGIXML_TEXT("string") && argc <= 1)
					return alloc_node(argc == 0 ? ast_func_string_0 : ast_func_string_1, xpath_type_string, args[0]);
				else if (name == PUGIXML_TEXT("string-length") && argc <= 1)
					return alloc_node(argc == 0 ? ast_func_string_length_0 : ast_func_string_length_1, xpath_type_number, args[0]);
				else if (name == PUGIXML_TEXT("starts-with") && argc == 2)
					return alloc_node(ast_func_starts_with, xpath_type_boolean, args[0], args[1]);
				else if (name == PUGIXML_TEXT("substring-before") && argc == 2)
					return alloc_node(ast_func_substring_before, xpath_type_string, args[0], args[1]);
				else if (name == PUGIXML_TEXT("substring-after") && argc == 2)
					return alloc_node(ast_func_substring_after, xpath_type_string, args[0], args[1]);
				else if (name == PUGIXML_TEXT("substring") && (argc == 2 || argc == 3))
					return alloc_node(argc == 2 ? ast_func_substring_2 : ast_func_substring_3, xpath_type_string, args[0], args[1]);
				else if (name == PUGIXML_TEXT("sum") && argc == 1)
				{
					if (args[0]->rettype() != xpath_type_node_set) return error("Function has to be applied to node set");
					return alloc_node(ast_func_sum, xpath_type_number, args[0]);
				}

				break;

			case 't':
				if (name == PUGIXML_TEXT("translate") && argc == 3)
					return alloc_node(ast_func_translate, xpath_type_string, args[0], args[1]);
				else if (name == PUGIXML_TEXT("true") && argc == 0)
					return alloc_node(ast_func_true, xpath_type_boolean);

				break;

			default:
				break;
			}

			return error("Unrecognized function or wrong parameter count");
		}